

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O1

void BounceBall(double delta_t)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  float fVar5;
  
  if (override_pos != 0) {
    return;
  }
  if (78.5 < ball_x) {
    iVar2 = rand();
    ball_x_inc = (float)iVar2 * -0.75 * 4.656613e-10 + -0.5;
    deg_rot_y_inc = -deg_rot_y_inc;
  }
  if (ball_x < -73.5) {
    iVar2 = rand();
    ball_x_inc = (float)iVar2 * 0.75 * 4.656613e-10 + 0.5;
    deg_rot_y_inc = -deg_rot_y_inc;
  }
  if (73.5 < ball_y) {
    iVar2 = rand();
    ball_y_inc = (float)iVar2 * -4.656613e-10 + -0.75;
  }
  if (ball_y < -62.475) {
    iVar2 = rand();
    ball_y_inc = (float)iVar2 * 4.656613e-10 + 0.75;
  }
  ball_x = ball_x_inc * (float)delta_t * 50.0 + ball_x;
  bVar1 = ball_y_inc < 0.0;
  ball_y = (float)delta_t * 50.0 * ball_y_inc + ball_y;
  fVar3 = ((ball_y + 73.5) * 90.0) / 147.0;
  fVar5 = 80.0;
  if (fVar3 <= 80.0) {
    fVar5 = fVar3;
  }
  fVar3 = 10.0;
  if (10.0 <= fVar5) {
    fVar3 = fVar5;
  }
  dVar4 = sin(((double)fVar3 / 360.0) * 6.283185307179586);
  ball_y_inc = (float)dVar4 * *(float *)(&DAT_0012f0c0 + (ulong)bVar1 * 4);
  return;
}

Assistant:

void BounceBall( double delta_t )
{
   GLfloat sign;
   GLfloat deg;

   if ( override_pos )
     return;

   /* Bounce on walls */
   if ( ball_x >  (BOUNCE_WIDTH/2 + WALL_R_OFFSET ) )
   {
      ball_x_inc = -0.5f - 0.75f * (GLfloat)rand() / (GLfloat)RAND_MAX;
      deg_rot_y_inc = -deg_rot_y_inc;
   }
   if ( ball_x < -(BOUNCE_HEIGHT/2 + WALL_L_OFFSET) )
   {
      ball_x_inc =  0.5f + 0.75f * (GLfloat)rand() / (GLfloat)RAND_MAX;
      deg_rot_y_inc = -deg_rot_y_inc;
   }

   /* Bounce on floor / roof */
   if ( ball_y >  BOUNCE_HEIGHT/2      )
   {
      ball_y_inc = -0.75f - 1.f * (GLfloat)rand() / (GLfloat)RAND_MAX;
   }
   if ( ball_y < -BOUNCE_HEIGHT/2*0.85 )
   {
      ball_y_inc =  0.75f + 1.f * (GLfloat)rand() / (GLfloat)RAND_MAX;
   }

   /* Update ball position */
   ball_x += ball_x_inc * ((float)delta_t*ANIMATION_SPEED);
   ball_y += ball_y_inc * ((float)delta_t*ANIMATION_SPEED);

  /*
   * Simulate the effects of gravity on Y movement.
   */
   if ( ball_y_inc < 0 ) sign = -1.0; else sign = 1.0;

   deg = (ball_y + BOUNCE_HEIGHT/2) * 90 / BOUNCE_HEIGHT;
   if ( deg > 80 ) deg = 80;
   if ( deg < 10 ) deg = 10;

   ball_y_inc = sign * 4.f * (float) sin_deg( deg );
}